

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O1

stbi_uc * stbi_load_gif_from_memory
                    (stbi_uc *buffer,int len,int **delays,int *x,int *y,int *z,int *comp,
                    int req_comp)

{
  stbi__context *s_00;
  int iVar1;
  int bytes_per_pixel;
  int iVar2;
  stbi__context *__src;
  int *piVar3;
  uint uVar4;
  long lVar5;
  int *piVar6;
  int iVar7;
  ulong uVar8;
  uchar *puVar9;
  long *in_FS_OFFSET;
  stbi__context s;
  uchar *local_89b8;
  stbi__context local_8978;
  stbi__gif local_88a0;
  
  local_8978.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
  local_8978.read_from_callbacks = 0;
  local_8978.img_buffer_end = buffer + len;
  piVar6 = y;
  local_8978.img_buffer = buffer;
  local_8978.img_buffer_original = buffer;
  local_8978.img_buffer_original_end = local_8978.img_buffer_end;
  iVar2 = stbi__gif_test(&local_8978);
  if (iVar2 == 0) {
    in_FS_OFFSET[-2] = (long)"not GIF";
    local_89b8 = (uchar *)0x0;
  }
  else {
    memset(&local_88a0,0,0x8870);
    if (delays != (int **)0x0) {
      *delays = (int *)0x0;
    }
    local_89b8 = (uchar *)0x0;
    lVar5 = 0;
    uVar8 = 0;
    do {
      s_00 = &local_8978;
      __src = (stbi__context *)
              stbi__gif_load_next(s_00,&local_88a0,comp,(int)lVar5,(stbi_uc *)piVar6);
      if (__src != (stbi__context *)0x0 && __src != s_00) {
        *x = local_88a0.w;
        *y = local_88a0.h;
        iVar1 = (int)uVar8;
        uVar4 = iVar1 + 1;
        iVar7 = local_88a0.h * local_88a0.w;
        iVar2 = iVar7 * 4;
        if (local_89b8 == (uchar *)0x0) {
          local_89b8 = (uchar *)malloc((long)(int)(iVar2 * uVar4));
          if (delays != (int **)0x0) {
            piVar3 = (int *)malloc((long)(int)uVar4 << 2);
            *delays = piVar3;
          }
        }
        else {
          puVar9 = (uchar *)realloc(local_89b8,(long)(int)(iVar2 * uVar4));
          if (puVar9 == (uchar *)0x0) {
            free(local_88a0.out);
            free(local_88a0.history);
            free(local_88a0.background);
            in_FS_OFFSET[-2] = (long)"outofmem";
          }
          else {
            local_89b8 = puVar9;
            if (delays != (int **)0x0) {
              piVar3 = (int *)realloc(*delays,(long)(int)uVar4 << 2);
              *delays = piVar3;
            }
          }
          if (puVar9 == (uchar *)0x0) {
            local_89b8 = (uchar *)0x0;
            goto LAB_001425fd;
          }
        }
        memcpy(local_89b8 + iVar2 * iVar1,__src,(long)iVar2);
        if (0 < iVar1) {
          lVar5 = (long)local_89b8 - (long)(iVar7 * 8);
        }
        if (delays != (int **)0x0) {
          (*delays)[uVar8] = local_88a0.delay;
        }
        uVar8 = (ulong)uVar4;
      }
    } while (__src != (stbi__context *)0x0 && __src != s_00);
    free(local_88a0.out);
    free(local_88a0.history);
    free(local_88a0.background);
    if ((req_comp & 0xfffffffbU) != 0) {
      local_89b8 = stbi__convert_format
                             (local_89b8,4,req_comp,local_88a0.w * (int)uVar8,local_88a0.h);
    }
    *z = (int)uVar8;
  }
LAB_001425fd:
  piVar6 = &stbi__vertically_flip_on_load_global;
  if (*(int *)((long)in_FS_OFFSET + -4) != 0) {
    piVar6 = (int *)(*in_FS_OFFSET + -8);
  }
  if ((*piVar6 != 0) && (iVar2 = *z, 0 < iVar2)) {
    iVar1 = *x;
    iVar7 = *y;
    bytes_per_pixel = *comp;
    puVar9 = local_89b8;
    do {
      stbi__vertical_flip(puVar9,iVar1,iVar7,bytes_per_pixel);
      puVar9 = puVar9 + iVar7 * iVar1 * bytes_per_pixel;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return local_89b8;
}

Assistant:

STBIDEF stbi_uc *stbi_load_gif_from_memory(stbi_uc const *buffer, int len, int **delays, int *x, int *y, int *z, int *comp, int req_comp)
{
   unsigned char *result;
   stbi__context s;
   stbi__start_mem(&s,buffer,len);

   result = (unsigned char*) stbi__load_gif_main(&s, delays, x, y, z, comp, req_comp);
   if (stbi__vertically_flip_on_load) {
      stbi__vertical_flip_slices( result, *x, *y, *z, *comp );
   }

   return result;
}